

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Amd.h
# Opt level: O0

int Eigen::internal::cs_tdfs<int>(int j,int k,int *head,int *next,int *post,int *stack)

{
  int iVar1;
  int iVar2;
  int top;
  int p;
  int i;
  int *stack_local;
  int *post_local;
  int *next_local;
  int *head_local;
  int k_local;
  int j_local;
  int local_4;
  
  top = 0;
  if ((((head == (int *)0x0) || (next == (int *)0x0)) || (post == (int *)0x0)) ||
     (stack == (int *)0x0)) {
    local_4 = -1;
  }
  else {
    *stack = j;
    k_local = k;
    while (-1 < top) {
      iVar1 = stack[top];
      iVar2 = head[iVar1];
      if (iVar2 == -1) {
        top = top + -1;
        post[k_local] = iVar1;
        k_local = k_local + 1;
      }
      else {
        head[iVar1] = next[iVar2];
        top = top + 1;
        stack[top] = iVar2;
      }
    }
    local_4 = k_local;
  }
  return local_4;
}

Assistant:

StorageIndex cs_tdfs(StorageIndex j, StorageIndex k, StorageIndex *head, const StorageIndex *next, StorageIndex *post, StorageIndex *stack)
{
  StorageIndex i, p, top = 0;
  if(!head || !next || !post || !stack) return (-1);    /* check inputs */
  stack[0] = j;                 /* place j on the stack */
  while (top >= 0)                /* while (stack is not empty) */
  {
    p = stack[top];           /* p = top of stack */
    i = head[p];              /* i = youngest child of p */
    if(i == -1)
    {
      top--;                 /* p has no unordered children left */
      post[k++] = p;        /* node p is the kth postordered node */
    }
    else
    {
      head[p] = next[i];   /* remove i from children of p */
      stack[++top] = i;     /* start dfs on child node i */
    }
  }
  return k;
}